

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

bool __thiscall TCLAP::Arg::argMatches(Arg *this,string *argFlag)

{
  bool bVar1;
  bool bVar2;
  string *__lhs;
  __type _Var3;
  bool bVar4;
  __type local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *argFlag_local;
  Arg *this_local;
  
  local_20 = argFlag;
  argFlag_local = (string *)this;
  flagStartString_abi_cxx11_();
  bVar2 = false;
  bVar1 = false;
  std::operator+(&local_40,&local_60,&this->_flag);
  _Var3 = std::operator==(argFlag,&local_40);
  if (_Var3) {
    bVar4 = std::operator!=(&this->_flag,"");
    local_d1 = true;
    if (bVar4) goto LAB_0010cb50;
  }
  __lhs = local_20;
  nameStartString_abi_cxx11_();
  bVar2 = true;
  std::operator+(&local_90,&local_b0,&this->_name);
  bVar1 = true;
  local_d1 = std::operator==(__lhs,&local_90);
LAB_0010cb50:
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return local_d1 != false;
}

Assistant:

inline bool Arg::argMatches( const std::string& argFlag ) const
{
	if ( ( argFlag == Arg::flagStartString() + _flag && _flag != "" ) ||
	       argFlag == Arg::nameStartString() + _name )
		return true;
	else
		return false;
}